

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

void __thiscall Clasp::DefaultUnfoundedCheck::reset(DefaultUnfoundedCheck *this)

{
  if ((this->solver_->levels_).super_type.ebo_.size != 0) {
    (this->invalidQ_).ebo_.size = 0;
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::reset() {
	assert(loopAtoms_.empty() && sourceQ_.empty() && ufs_.empty() && todo_.empty());
	// remember assignments from top-level -
	// the reset may come from a stop request and we might
	// want to continue later
	if (solver_->decisionLevel()) {
		invalidQ_.clear();
	}
}